

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O0

void test_bson_append_int32(void)

{
  byte bVar1;
  bson_t *a;
  bson_t *b_00;
  bson_t *b2;
  bson_t *b;
  
  a = (bson_t *)bson_new();
  bVar1 = bson_append_int32(a,"a",0xffffffff,0xffffff85);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x22e,"test_bson_append_int32","bson_append_int32 (b, \"a\", -1, -123)");
    abort();
  }
  bVar1 = bson_append_int32(a,"c",0xffffffff,0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x22f,"test_bson_append_int32","bson_append_int32 (b, \"c\", -1, 0)");
    abort();
  }
  bVar1 = bson_append_int32(a,"b",0xffffffff,0x7b);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x230,"test_bson_append_int32","bson_append_int32 (b, \"b\", -1, 123)");
    abort();
  }
  b_00 = get_bson("test33.bson");
  BSON_ASSERT_BSON_EQUAL(a,b_00);
  bson_destroy(a);
  bson_destroy(b_00);
  return;
}

Assistant:

static void
test_bson_append_int32 (void)
{
   bson_t *b;
   bson_t *b2;

   b = bson_new ();
   BSON_ASSERT (bson_append_int32 (b, "a", -1, -123));
   BSON_ASSERT (bson_append_int32 (b, "c", -1, 0));
   BSON_ASSERT (bson_append_int32 (b, "b", -1, 123));
   b2 = get_bson ("test33.bson");
   BSON_ASSERT_BSON_EQUAL (b, b2);
   bson_destroy (b);
   bson_destroy (b2);
}